

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_9ea68::PedestrianPlugIn::~PedestrianPlugIn(PedestrianPlugIn *this)

{
  ~PedestrianPlugIn(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~PedestrianPlugIn() {}